

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithLongLongIntegerParameter_TestShell::
~TEST_MockExpectedCall_callWithLongLongIntegerParameter_TestShell
          (TEST_MockExpectedCall_callWithLongLongIntegerParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithLongLongIntegerParameter_TestShell *this_local;
  
  ~TEST_MockExpectedCall_callWithLongLongIntegerParameter_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithLongLongIntegerParameter)
{
    const SimpleString paramName = "paramName";
    long long value = 777;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("long long int", call->getInputParameterType(paramName).asCharString());
    LONGLONGS_EQUAL(value, call->getInputParameter(paramName).getLongLongIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> long long int paramName: <777 (0x309)>", call->callToString().asCharString());
}